

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

RunningSection * __thiscall
Catch::RunningSection::findOrAddSubSection(RunningSection *this,string *name,bool *changed)

{
  pointer *pppRVar1;
  pointer pcVar2;
  iterator __position;
  int iVar3;
  RunningSection *pRVar4;
  pointer ppRVar5;
  bool bVar6;
  RunningSection *subSection;
  RunningSection *local_50;
  size_t local_48;
  
  ppRVar5 = (this->m_subSections).
            super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar5 !=
      (this->m_subSections).
      super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pcVar2 = ((*ppRVar5)->m_name)._M_dataplus._M_p;
      local_50 = (RunningSection *)&stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + ((*ppRVar5)->m_name)._M_string_length);
      pRVar4 = local_50;
      if (local_48 == name->_M_string_length) {
        if (local_48 == 0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp(local_50,(name->_M_dataplus)._M_p,local_48);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (pRVar4 != (RunningSection *)&stack0xffffffffffffffc0) {
        operator_delete(pRVar4);
      }
      if (bVar6) {
        return *ppRVar5;
      }
      ppRVar5 = ppRVar5 + 1;
    } while (ppRVar5 !=
             (this->m_subSections).
             super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  pRVar4 = (RunningSection *)operator_new(0x48);
  pRVar4->m_state = Unknown;
  pRVar4->m_parent = this;
  (pRVar4->m_name)._M_dataplus._M_p = (pointer)&(pRVar4->m_name).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pRVar4->m_name,pcVar2,pcVar2 + name->_M_string_length);
  (pRVar4->m_subSections).
  super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pRVar4->m_subSections).
  super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pRVar4->m_subSections).
  super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __position._M_current =
       (this->m_subSections).
       super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_50 = pRVar4;
  if (__position._M_current ==
      (this->m_subSections).
      super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Catch::RunningSection*,std::allocator<Catch::RunningSection*>>::
    _M_realloc_insert<Catch::RunningSection*const&>
              ((vector<Catch::RunningSection*,std::allocator<Catch::RunningSection*>> *)
               &this->m_subSections,__position,&local_50);
  }
  else {
    *__position._M_current = pRVar4;
    pppRVar1 = &(this->m_subSections).
                super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppRVar1 = *pppRVar1 + 1;
  }
  this->m_state = Branch;
  *changed = true;
  return local_50;
}

Assistant:

RunningSection* findOrAddSubSection( std::string const& name, bool& changed ) {
            for(    SubSections::const_iterator it = m_subSections.begin();
                    it != m_subSections.end();
                    ++it)
                if( (*it)->getName() == name )
                    return *it;
            RunningSection* subSection = new RunningSection( this, name );
            m_subSections.push_back( subSection );
            m_state = Branch;
            changed = true;
            return subSection;
        }